

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O1

uint8_t * __thiscall
BTree<StringBTree,_StringKey>::searchWithComparison
          (BTree<StringBTree,_StringKey> *this,SearchResult *result,uint8_t *data,uint count,
          StringKey *key,KeyCompareOp compOp)

{
  uint uVar1;
  int iVar2;
  code *pcVar3;
  ushort uVar4;
  uint uVar5;
  long *plVar6;
  uint uVar7;
  uint8_t *puVar8;
  uint uVar9;
  uint uVar10;
  code *in_stack_00000008;
  long in_stack_00000010;
  
  uVar4 = swap_bytes(*(undefined2 *)data);
  uVar9 = uVar4 >> 4 & 0x7ff;
  result->upperBound = uVar9;
  if ((uVar4 >> 4 & 0x7ff) == 0) {
    uVar5 = 0;
  }
  else {
    plVar6 = (long *)((long)&this->m_data + in_stack_00000010);
    uVar10 = 0;
    do {
      pcVar3 = in_stack_00000008;
      if (((ulong)in_stack_00000008 & 1) != 0) {
        pcVar3 = *(code **)(in_stack_00000008 + *plVar6 + -1);
      }
      uVar5 = uVar9 - uVar10 >> 1;
      uVar7 = uVar5 + uVar10;
      uVar4 = swap_bytes(*(undefined2 *)(data + ((uVar7 * 4 + 4) * 3 >> 3)));
      uVar5 = uVar5 + 1 + uVar10;
      iVar2 = (*pcVar3)(plVar6,key,data + (uVar4 >> ((char)uVar7 * '\x04' & 4U) & 0xfff));
      if (iVar2 == 0) {
        result->lowerBound = uVar7;
        result->index = uVar7;
        uVar1 = uVar10;
      }
      else {
        uVar1 = uVar5;
        if (iVar2 < 1) {
          uVar9 = uVar7;
          uVar5 = uVar7;
          uVar1 = uVar10;
        }
      }
      uVar10 = uVar1;
      if (iVar2 == 0) {
        return data + (uVar4 >> ((char)uVar7 * '\x04' & 4U) & 0xfff);
      }
    } while (uVar10 < uVar9);
  }
  result->lowerBound = uVar5;
  result->index = 0xffffffff;
  puVar8 = (uint8_t *)0x0;
  if ((count != 0) && (uVar5 != result->upperBound)) {
    uVar4 = swap_bytes(*(undefined2 *)(data + (uVar5 * 0xc + 0xc >> 3)));
    puVar8 = data + (uVar4 >> ((byte)(uVar5 << 2) & 4) & 0xfff);
  }
  return puVar8;
}

Assistant:

const uint8_t* searchWithComparison(SearchResult& result, const uint8_t* data, unsigned int count, const Key& key, KeyCompareOp compOp) const
	{
		const auto& self = static_cast<const Derived&>(*this);

		auto high = getBitsAt(data, 0) & UINT32_C(0x7FF), low = 0u;
		auto index = 0u;
		const uint8_t* subData;
		
		result.upperBound = high;

		while (low < high) {
			const auto mid = low + (high - low) / 2;
			index = mid + 1;

			const auto offset = getBitsAt(data, index);
			subData = advancePointer(data, offset);

			const auto ret = (self.*compOp)(key, subData);
			if (ret == 0) {
				result.lowerBound = mid;
				result.index = mid;
				goto done;
			} else if (ret > 0) {
				low = index;
			} else if (ret < 0) {
				high = mid;
				index = mid;
			}
		}
		
		subData = nullptr;

		result.lowerBound = index;
		result.index = INVALID_INDEX;
		
		if (count != 0 && index != result.upperBound) {
			const auto offset = getBitsAt(data, index + 1);
			subData = advancePointer(data, offset);
		}
		
	done:
		return subData;
	}